

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegRangePtr xmlRegCopyRange(xmlRegParserCtxtPtr ctxt,xmlRegRangePtr range)

{
  xmlChar *pxVar1;
  xmlRegRangePtr ret;
  xmlRegRangePtr range_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (range == (xmlRegRangePtr)0x0) {
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlRegParserCtxtPtr)
                 xmlRegNewRange(ctxt,range->neg,range->type,range->start,range->end);
    if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
      ctxt_local = (xmlRegParserCtxtPtr)0x0;
    }
    else if (range->blockName != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(range->blockName);
      *(xmlChar **)&ctxt_local->error = pxVar1;
      if (*(xmlChar **)&ctxt_local->error == (xmlChar *)0x0) {
        xmlRegexpErrMemory(ctxt,"allocating range");
        xmlRegFreeRange((xmlRegRangePtr)ctxt_local);
        ctxt_local = (xmlRegParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlRegRangePtr)ctxt_local;
}

Assistant:

static xmlRegRangePtr
xmlRegCopyRange(xmlRegParserCtxtPtr ctxt, xmlRegRangePtr range) {
    xmlRegRangePtr ret;

    if (range == NULL)
	return(NULL);

    ret = xmlRegNewRange(ctxt, range->neg, range->type, range->start,
                         range->end);
    if (ret == NULL)
        return(NULL);
    if (range->blockName != NULL) {
	ret->blockName = xmlStrdup(range->blockName);
	if (ret->blockName == NULL) {
	    xmlRegexpErrMemory(ctxt, "allocating range");
	    xmlRegFreeRange(ret);
	    return(NULL);
	}
    }
    return(ret);
}